

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_area.h
# Opt level: O3

void __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex corner_id,int *prediction)

{
  ulong uVar1;
  int i;
  long lVar2;
  Scalar_conflict result;
  CornerIndex ci;
  CornerIndex ci_00;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  VectorD<long,_3> pos_next;
  VectorD<long,_3> delta_prev;
  VectorD<long,_3> delta_next;
  VertexCornersIterator<draco::CornerTable> cit;
  VectorD<long,_3> pos_cent;
  VectorD<long,_3> pos_prev;
  ulong local_f8;
  long lStack_f0;
  long lStack_e8;
  VectorD<long,_3> local_d8;
  uint local_c0;
  uint local_bc;
  long local_b8 [4];
  long local_98 [3];
  int *local_80;
  VertexCornersIterator<draco::CornerTable> local_78;
  VectorD<long,_3> local_60;
  VectorD<long,_3> local_48;
  
  local_78.corner_table_ =
       (this->
       super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
       ).mesh_data_.corner_table_;
  local_78.left_traversal_ = true;
  local_78.start_corner_.value_ = corner_id.value_;
  local_78.corner_.value_ = corner_id.value_;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ::GetPositionForCorner
            (&local_60,
             &this->
              super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ,corner_id);
  lStack_f0 = 0;
  lStack_e8 = 0;
  uVar6 = 0;
  if (corner_id.value_ != 0xffffffff) {
    local_bc = corner_id.value_ - 2;
    if (0x55555555 < corner_id.value_ * -0x55555555 + 0xaaaaaaab) {
      local_bc = corner_id.value_ + 1;
    }
    local_c0 = ((corner_id.value_ * -0x55555555 < 0x55555556) - 1 | 2) + corner_id.value_;
    lVar4 = 0;
    lVar5 = 0;
    local_80 = prediction;
    do {
      ci_00.value_ = local_c0;
      ci.value_ = local_bc;
      if ((this->
          super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
          ).normal_prediction_mode_ != ONE_TRIANGLE) {
        ci.value_ = corner_id.value_ - 2;
        if (0x55555555 < corner_id.value_ * -0x55555555 + 0xaaaaaaab) {
          ci.value_ = corner_id.value_ + 1;
        }
        if (corner_id.value_ * -0x55555555 < 0x55555556) {
          ci_00.value_ = corner_id.value_ + 2;
        }
        else {
          ci_00.value_ = corner_id.value_ - 1;
        }
      }
      MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
      ::GetPositionForCorner
                (&local_d8,
                 &this->
                  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                 ,ci);
      MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
      ::GetPositionForCorner
                (&local_48,
                 &this->
                  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                 ,ci_00);
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      lVar2 = 0;
      do {
        local_98[lVar2] = local_d8.v_._M_elems[lVar2] - local_60.v_._M_elems[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      local_b8[0] = 0;
      local_b8[1] = 0;
      local_b8[2] = 0;
      lVar2 = 0;
      do {
        local_b8[lVar2] = local_48.v_._M_elems[lVar2] - local_60.v_._M_elems[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      uVar6 = uVar6 + (local_b8[2] * local_98[1] - local_b8[1] * local_98[2]);
      lVar5 = lVar5 + (local_98[2] * local_b8[0] - local_b8[2] * local_98[0]);
      lVar4 = lVar4 + (local_98[0] * local_b8[1] - local_b8[0] * local_98[1]);
      VertexCornersIterator<draco::CornerTable>::Next(&local_78);
      corner_id.value_ = local_78.corner_.value_;
    } while (local_78.corner_.value_ != 0xffffffff);
    lStack_f0 = lVar5;
    lStack_e8 = lVar4;
    prediction = local_80;
  }
  local_f8 = uVar6;
  if ((this->
      super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
      ).normal_prediction_mode_ == ONE_TRIANGLE) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      uVar1 = (&local_f8)[lVar4];
      uVar3 = -uVar1;
      if (0 < (long)uVar1) {
        uVar3 = uVar1;
      }
      if ((uVar3 ^ 0x7fffffffffffffff) < uVar6) goto LAB_0017763a;
      uVar6 = uVar6 + uVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if ((long)(int)uVar6 < 0x20000001) goto LAB_0017763a;
    local_d8.v_._M_elems[0] = 0;
    local_d8.v_._M_elems[1] = 0;
    local_d8.v_._M_elems[2] = 0;
    lVar4 = 0;
    do {
      local_d8.v_._M_elems[lVar4] =
           (long)(&local_f8)[lVar4] / (long)((ulong)(long)(int)uVar6 >> 0x1d);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  else {
    lVar4 = 0;
    uVar6 = 0;
    do {
      uVar1 = (&local_f8)[lVar4];
      uVar3 = -uVar1;
      if (0 < (long)uVar1) {
        uVar3 = uVar1;
      }
      if ((uVar3 ^ 0x7fffffffffffffff) < uVar6) {
        uVar6 = 0x7fffffffffffffff;
        goto LAB_001775f9;
      }
      uVar6 = uVar6 + uVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (uVar6 < 0x20000001) goto LAB_0017763a;
LAB_001775f9:
    local_d8.v_._M_elems[0] = 0;
    local_d8.v_._M_elems[1] = 0;
    local_d8.v_._M_elems[2] = 0;
    lVar4 = 0;
    do {
      local_d8.v_._M_elems[lVar4] = (long)(&local_f8)[lVar4] / (long)(uVar6 >> 0x1d);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  lStack_e8._0_4_ = (int)local_d8.v_._M_elems[2];
  local_f8 = local_d8.v_._M_elems[0];
  lStack_f0._0_4_ = (undefined4)local_d8.v_._M_elems[1];
LAB_0017763a:
  *(ulong *)prediction = CONCAT44((undefined4)lStack_f0,(undefined4)local_f8);
  prediction[2] = (int)lStack_e8;
  return;
}

Assistant:

void ComputePredictedValue(CornerIndex corner_id,
                             DataTypeT *prediction) override {
    DRACO_DCHECK(this->IsInitialized());
    typedef typename MeshDataT::CornerTable CornerTable;
    const CornerTable *const corner_table = this->mesh_data_.corner_table();
    // Going to compute the predicted normal from the surrounding triangles
    // according to the connectivity of the given corner table.
    VertexCornersIterator<CornerTable> cit(corner_table, corner_id);
    // Position of central vertex does not change in loop.
    const VectorD<int64_t, 3> pos_cent = this->GetPositionForCorner(corner_id);
    // Computing normals for triangles and adding them up.

    VectorD<int64_t, 3> normal;
    CornerIndex c_next, c_prev;
    while (!cit.End()) {
      // Getting corners.
      if (this->normal_prediction_mode_ == ONE_TRIANGLE) {
        c_next = corner_table->Next(corner_id);
        c_prev = corner_table->Previous(corner_id);
      } else {
        c_next = corner_table->Next(cit.Corner());
        c_prev = corner_table->Previous(cit.Corner());
      }
      const VectorD<int64_t, 3> pos_next = this->GetPositionForCorner(c_next);
      const VectorD<int64_t, 3> pos_prev = this->GetPositionForCorner(c_prev);

      // Computing delta vectors to next and prev.
      const VectorD<int64_t, 3> delta_next = pos_next - pos_cent;
      const VectorD<int64_t, 3> delta_prev = pos_prev - pos_cent;

      // Computing cross product.
      const VectorD<int64_t, 3> cross = CrossProduct(delta_next, delta_prev);

      // Prevent signed integer overflows by doing math as unsigned.
      auto normal_data = reinterpret_cast<uint64_t *>(normal.data());
      auto cross_data = reinterpret_cast<const uint64_t *>(cross.data());
      normal_data[0] = normal_data[0] + cross_data[0];
      normal_data[1] = normal_data[1] + cross_data[1];
      normal_data[2] = normal_data[2] + cross_data[2];

      cit.Next();
    }

    // Convert to int32_t, make sure entries are not too large.
    constexpr int64_t upper_bound = 1 << 29;
    if (this->normal_prediction_mode_ == ONE_TRIANGLE) {
      const int32_t abs_sum = static_cast<int32_t>(normal.AbsSum());
      if (abs_sum > upper_bound) {
        const int64_t quotient = abs_sum / upper_bound;
        normal = normal / quotient;
      }
    } else {
      const int64_t abs_sum = normal.AbsSum();
      if (abs_sum > upper_bound) {
        const int64_t quotient = abs_sum / upper_bound;
        normal = normal / quotient;
      }
    }
    DRACO_DCHECK_LE(normal.AbsSum(), upper_bound);
    prediction[0] = static_cast<int32_t>(normal[0]);
    prediction[1] = static_cast<int32_t>(normal[1]);
    prediction[2] = static_cast<int32_t>(normal[2]);
  }